

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_ssm_scan(ggml_context *ctx,ggml_tensor *s,ggml_tensor *x,ggml_tensor *dt,ggml_tensor *A,
             ggml_tensor *B,ggml_tensor *C)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  _Bool _Var5;
  ggml_tensor *pgVar6;
  char *pcVar7;
  int line;
  long local_38;
  
  _Var5 = ggml_is_contiguous_n(s,0);
  if (_Var5) {
    _Var5 = ggml_is_contiguous_n(x,0);
    if (_Var5) {
      _Var5 = ggml_is_contiguous_n(dt,0);
      if (_Var5) {
        _Var5 = ggml_is_contiguous_n(A,0);
        if (_Var5) {
          if ((A->ne[2] == 1) && (A->ne[3] == 1)) {
            if (B->ne[3] == 1) {
              if (s->ne[3] == 1) {
                if (B->nb[0] == type_traits[B->type].type_size) {
                  if (C->nb[0] == type_traits[C->type].type_size) {
                    lVar1 = x->ne[0];
                    if ((((lVar1 == dt->ne[0]) && (x->ne[1] == dt->ne[1])) &&
                        (x->ne[2] == dt->ne[2])) && (x->ne[3] == dt->ne[3])) {
                      if (((B->ne[0] == C->ne[0]) && (B->ne[1] == C->ne[1])) &&
                         ((B->ne[2] == C->ne[2] && (C->ne[3] == 1)))) {
                        lVar2 = x->ne[2];
                        if (s->ne[2] == lVar2) {
                          lVar3 = s->ne[1];
                          if (lVar1 == lVar3) {
                            lVar4 = s->ne[0];
                            if (A->ne[0] == lVar4) {
                              if (A->ne[1] == lVar3) {
                                if (B->ne[0] == lVar4) {
                                  if (B->ne[1] == x->ne[1]) {
                                    if (B->ne[2] == lVar2) {
                                      local_38 = lVar3 * s->ne[2] * lVar4 +
                                                 x->ne[1] * lVar1 * lVar2 * x->ne[3];
                                      pgVar6 = ggml_new_tensor_impl
                                                         (ctx,GGML_TYPE_F32,1,&local_38,
                                                          (ggml_tensor *)0x0,0);
                                      pgVar6->op = GGML_OP_SSM_SCAN;
                                      pgVar6->src[0] = s;
                                      pgVar6->src[1] = x;
                                      pgVar6->src[2] = dt;
                                      pgVar6->src[3] = A;
                                      pgVar6->src[4] = B;
                                      pgVar6->src[5] = C;
                                      return pgVar6;
                                    }
                                    pcVar7 = "B->ne[2] == n_seqs";
                                    line = 0x11ee;
                                  }
                                  else {
                                    pcVar7 = "B->ne[1] == n_seq_tokens";
                                    line = 0x11ed;
                                  }
                                }
                                else {
                                  pcVar7 = "B->ne[0] == d_state";
                                  line = 0x11ec;
                                }
                              }
                              else {
                                pcVar7 = "A->ne[1] == d_inner";
                                line = 0x11eb;
                              }
                            }
                            else {
                              pcVar7 = "A->ne[0] == d_state";
                              line = 0x11ea;
                            }
                          }
                          else {
                            pcVar7 = "x->ne[0] == d_inner";
                            line = 0x11e9;
                          }
                        }
                        else {
                          pcVar7 = "s->ne[2] == n_seqs";
                          line = 0x11e8;
                        }
                      }
                      else {
                        pcVar7 = "ggml_are_same_shape(B, C)";
                        line = 0x11e0;
                      }
                    }
                    else {
                      pcVar7 = "ggml_are_same_shape(x, dt)";
                      line = 0x11df;
                    }
                  }
                  else {
                    pcVar7 = "C->nb[0] == ggml_type_size(C->type)";
                    line = 0x11de;
                  }
                }
                else {
                  pcVar7 = "B->nb[0] == ggml_type_size(B->type)";
                  line = 0x11dd;
                }
              }
              else {
                pcVar7 = "ggml_is_3d(s)";
                line = 0x11dc;
              }
            }
            else {
              pcVar7 = "ggml_is_3d(B)";
              line = 0x11db;
            }
          }
          else {
            pcVar7 = "ggml_is_matrix(A)";
            line = 0x11da;
          }
        }
        else {
          pcVar7 = "ggml_is_contiguous(A)";
          line = 0x11d9;
        }
      }
      else {
        pcVar7 = "ggml_is_contiguous(dt)";
        line = 0x11d8;
      }
    }
    else {
      pcVar7 = "ggml_is_contiguous(x)";
      line = 0x11d7;
    }
  }
  else {
    pcVar7 = "ggml_is_contiguous(s)";
    line = 0x11d6;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar7);
}

Assistant:

struct ggml_tensor * ggml_ssm_scan(
        struct ggml_context * ctx,
        struct ggml_tensor  * s,
        struct ggml_tensor  * x,
        struct ggml_tensor  * dt,
        struct ggml_tensor  * A,
        struct ggml_tensor  * B,
        struct ggml_tensor  * C) {
    GGML_ASSERT(ggml_is_contiguous(s));
    GGML_ASSERT(ggml_is_contiguous(x));
    GGML_ASSERT(ggml_is_contiguous(dt));
    GGML_ASSERT(ggml_is_contiguous(A));
    GGML_ASSERT(ggml_is_matrix(A));
    GGML_ASSERT(ggml_is_3d(B));
    GGML_ASSERT(ggml_is_3d(s));
    GGML_ASSERT(B->nb[0] == ggml_type_size(B->type));
    GGML_ASSERT(C->nb[0] == ggml_type_size(C->type));
    GGML_ASSERT(ggml_are_same_shape(x, dt));
    GGML_ASSERT(ggml_are_same_shape(B, C));

    {
        const int64_t d_state      = s->ne[0];
        const int64_t d_inner      = s->ne[1];
        const int64_t n_seq_tokens = x->ne[1];
        const int64_t n_seqs       = x->ne[2];

        GGML_ASSERT(s->ne[2] == n_seqs);
        GGML_ASSERT(x->ne[0] == d_inner);
        GGML_ASSERT(A->ne[0] == d_state);
        GGML_ASSERT(A->ne[1] == d_inner);
        GGML_ASSERT(B->ne[0] == d_state);
        GGML_ASSERT(B->ne[1] == n_seq_tokens);
        GGML_ASSERT(B->ne[2] == n_seqs);
    }

    // concatenated y + ssm_states
    struct ggml_tensor * result = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, ggml_nelements(x) + ggml_nelements(s));

    result->op   = GGML_OP_SSM_SCAN;
    result->src[0] = s;
    result->src[1] = x;
    result->src[2] = dt;
    result->src[3] = A;
    result->src[4] = B;
    result->src[5] = C;

    return result;
}